

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O0

void __thiscall
rcg::Buffer::Buffer(Buffer *this,shared_ptr<const_rcg::GenTLWrapper> *_gentl,Stream *_parent)

{
  element_type *in_RDX;
  shared_ptr<const_rcg::GenTLWrapper> *in_RDI;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_ffffffffffffffd8;
  
  std::shared_ptr<const_rcg::GenTLWrapper>::shared_ptr
            ((shared_ptr<const_rcg::GenTLWrapper> *)0x128c76);
  std::shared_ptr<GenApi_3_4::CNodeMapRef>::shared_ptr
            ((shared_ptr<GenApi_3_4::CNodeMapRef> *)0x128c84);
  std::shared_ptr<GenApi_3_4::CChunkAdapter>::shared_ptr
            ((shared_ptr<GenApi_3_4::CChunkAdapter> *)0x128c92);
  (in_RDI->super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = in_RDX;
  std::shared_ptr<const_rcg::GenTLWrapper>::operator=(in_RDI,in_stack_ffffffffffffffd8);
  in_RDI[1].super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined1 *)
   &in_RDI[2].super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = 0;
  return;
}

Assistant:

Buffer::Buffer(const std::shared_ptr<const GenTLWrapper> &_gentl, Stream *_parent)
{
  parent=_parent;
  gentl=_gentl;
  buffer=0;
  multipart=false;
}